

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

StructSize capnp::anon_unknown_71::structSizeFromSchema(StructSchema schema)

{
  ushort uVar1;
  uint uVar2;
  Schema local_40;
  Reader local_38;
  
  Schema::getProto(&local_38,&local_40);
  uVar2 = 0;
  if (local_38._reader.dataSize < 0x80) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)local_38._reader.data + 0xe);
    if (0xcf < local_38._reader.dataSize) {
      uVar2 = (uint)*(ushort *)((long)local_38._reader.data + 0x18) << 0x10;
    }
  }
  return (StructSize)(uVar1 | uVar2);
}

Assistant:

inline _::StructSize structSizeFromSchema(StructSchema schema) {
  auto node = schema.getProto().getStruct();
  return _::StructSize(
      bounded(node.getDataWordCount()) * WORDS,
      bounded(node.getPointerCount()) * POINTERS);
}